

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall llama_model::load_arch(llama_model *this,llama_model_loader *ml)

{
  llm_arch lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  llama_model_loader *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  llama_model_loader *in_stack_ffffffffffffff68;
  string local_30 [48];
  
  lVar1 = llama_model_loader::get_arch(in_RSI);
  *(llm_arch *)&in_RDI->field_0x4 = lVar1;
  if (*(int *)&in_RDI->field_0x4 == 0x42) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    llama_model_loader::get_arch_name_abi_cxx11_(in_stack_ffffffffffffff68);
    std::operator+((char *)in_RDI,__rhs);
    std::operator+(in_RDI,(char *)__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_30);
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void llama_model::load_arch(llama_model_loader & ml) {
    arch = ml.get_arch();
    if (arch == LLM_ARCH_UNKNOWN) {
        throw std::runtime_error("unknown model architecture: '" + ml.get_arch_name() + "'");
    }
}